

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_reader.cc
# Opt level: O1

void __thiscall NanomsgReader::NanomsgReader(NanomsgReader *this,string *addr)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  int size;
  stringstream ss;
  string local_1d0 [36];
  undefined4 local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  PacketReader::PacketReader(&this->super_PacketReader);
  (this->super_PacketReader)._vptr_PacketReader = (_func_int **)&PTR__NanomsgReader_001e34e8;
  iVar1 = nn_socket(1,0x21);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_socket: ",0xb);
    iVar1 = nn_errno();
    pcVar3 = nn_strerror(iVar1);
    std::operator<<(local_198,pcVar3);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1ac = 0x1000000;
  iVar2 = nn_setsockopt(iVar1,0,3,&local_1ac,4);
  if (iVar2 < 0) {
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_setsockopt: ",0xf);
    iVar1 = nn_errno();
    pcVar3 = nn_strerror(iVar1);
    std::operator<<(local_198,pcVar3);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = nn_connect(iVar1,(addr->_M_dataplus)._M_p);
  if (iVar2 < 0) {
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_connect: ",0xc);
    iVar1 = nn_errno();
    pcVar3 = nn_strerror(iVar1);
    std::operator<<(local_198,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(addr->_M_dataplus)._M_p,addr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,local_1d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
  if (-1 < iVar2) {
    this->fd_ = iVar1;
    return;
  }
  nn_close(iVar1);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_setsockopt: ",0xf);
  iVar1 = nn_errno();
  pcVar3 = nn_strerror(iVar1);
  std::operator<<(local_198,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(addr->_M_dataplus)._M_p,addr->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_1d0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NanomsgReader::NanomsgReader(const std::string& addr) {
  int rv;

  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  // Fix receive buffer size to "plenty".
  // HRIT packet stream is 50KB/sec so this gives us 5+ minutes
  // before the buffer is full and nanomsg starts dropping messages.
  int size = 16 * 1024 * 1024;
  rv = nn_setsockopt(fd, NN_SOL_SOCKET, NN_RCVBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  rv = nn_connect(fd, addr.c_str());
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << addr << ")";
    throw std::runtime_error(ss.str());
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << addr << ")";
    throw std::runtime_error(ss.str());
  }

  fd_ = fd;
}